

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::AtomTypesSectionParser::parseLine
          (AtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  undefined8 uVar3;
  AtomType *pAVar4;
  size_t sVar5;
  ostream *poVar6;
  uint in_ECX;
  ForceField *in_RDX;
  RealType mass;
  int ident;
  AtomType *atomType;
  AtomType *baseAtomType;
  string baseAtomTypeName;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  string *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  StringTokenizer *in_stack_fffffffffffffe88;
  StringTokenizer *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  errorStruct *in_stack_fffffffffffffec0;
  AtomType *m;
  AtomType *in_stack_fffffffffffffed0;
  errorStruct *peVar7;
  undefined4 in_stack_fffffffffffffed8;
  AtomType *in_stack_fffffffffffffef0;
  string local_f0 [24];
  StringTokenizer *in_stack_ffffffffffffff28;
  string local_d0 [32];
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
             (allocator<char> *)in_stack_fffffffffffffeb0);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffe90);
  local_b0 = iVar1;
  if (iVar1 < 2) {
    peVar7 = &painCave;
    snprintf(painCave.errMsg,2000,"AtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    peVar7->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff28);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff28);
    pAVar2 = ForceField::getAtomType
                       ((ForceField *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    m = pAVar2;
    if (pAVar2 == (AtomType *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffec0 = &painCave;
      snprintf(painCave.errMsg,2000,
               "AtomTypesSectionParser Error: Could not find matching base atom type to %s at line %d\n"
               ,uVar3,(ulong)local_1c);
      (((ForceField *)in_stack_fffffffffffffec0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.optional_ = true;
      (((ForceField *)in_stack_fffffffffffffec0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.defaultValue_ = false;
      (((ForceField *)in_stack_fffffffffffffec0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.empty_ = false;
      (((ForceField *)in_stack_fffffffffffffec0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.field_0x2b = 0;
      simError();
    }
    pAVar4 = ForceField::getAtomType
                       ((ForceField *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (pAVar4 == (AtomType *)0x0) {
      pAVar4 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(in_stack_fffffffffffffef0);
      (*pAVar4->_vptr_AtomType[2])(pAVar4,pAVar2);
      sVar5 = ForceField::getNAtomType((ForceField *)0x1e8bc6);
      AtomType::setIdent(pAVar4,(int)sVar5);
      AtomType::setName((AtomType *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                        in_stack_fffffffffffffe78);
      ForceField::addAtomType
                (in_RDX,(string *)CONCAT44(iVar1,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"duplicate atom type: ");
      poVar6 = std::operator<<(poVar6,local_d0);
      poVar6 = std::operator<<(poVar6," on line ");
      in_stack_fffffffffffffe88 = (StringTokenizer *)std::ostream::operator<<(poVar6,local_1c);
      std::operator<<((ostream *)in_stack_fffffffffffffe88,"\n");
    }
    in_stack_fffffffffffffe87 = StringTokenizer::hasMoreTokens(in_stack_fffffffffffffe88);
    if ((bool)in_stack_fffffffffffffe87) {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffec0);
      AtomType::setMass(in_stack_fffffffffffffed0,(RealType)m);
    }
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer
            ((StringTokenizer *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  return;
}

Assistant:

void AtomTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in AtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "AtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string baseAtomTypeName = tokenizer.nextToken();

      AtomType* baseAtomType =
          dynamic_cast<AtomType*>(ff.getAtomType(baseAtomTypeName));

      if (baseAtomType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "AtomTypesSectionParser Error: Could not find matching base atom "
            "type to "
            "%s at line %d\n",
            baseAtomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      AtomType* atomType = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        atomType = new AtomType();
        atomType->useBase(baseAtomType);
        int ident = ff.getNAtomType();
        atomType->setIdent(ident);
        atomType->setName(atomTypeName);
        ff.addAtomType(atomTypeName, atomType);
      } else {
        std::cerr << "duplicate atom type: " << atomTypeName << " on line "
                  << lineNo << "\n";
      }

      if (tokenizer.hasMoreTokens()) {
        RealType mass = tokenizer.nextTokenAsDouble();
        atomType->setMass(mass);
      }
    }
  }